

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

ParserResult * __thiscall
Catch::clara::detail::ExeName::set
          (ParserResult *__return_storage_ptr__,ExeName *this,string *newName)

{
  element_type *peVar1;
  long lVar2;
  string filename;
  
  lVar2 = ::std::__cxx11::string::find_last_of((char *)newName,0x15a74b);
  if (lVar2 == -1) {
    ::std::__cxx11::string::string((string *)&filename,(string *)newName);
  }
  else {
    ::std::__cxx11::string::substr((ulong)&filename,(ulong)newName);
  }
  ::std::__cxx11::string::_M_assign
            ((string *)
             (this->m_name).
             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  peVar1 = (this->m_ref).
           super___shared_ptr<Catch::clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (peVar1 == (element_type *)0x0) {
    *(undefined8 *)
     &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
      super_ResultBase.m_type = 0;
    (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_0018b6d8;
    (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
    (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
    (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
  }
  else {
    (*(peVar1->super_BoundRef)._vptr_BoundRef[4])(__return_storage_ptr__,peVar1,&filename);
  }
  ::std::__cxx11::string::~string((string *)&filename);
  return __return_storage_ptr__;
}

Assistant:

auto set( std::string const& newName ) -> ParserResult {

            auto lastSlash = newName.find_last_of( "\\/" );
            auto filename = ( lastSlash == std::string::npos )
                    ? newName
                    : newName.substr( lastSlash+1 );

            *m_name = filename;
            if( m_ref )
                return m_ref->setValue( filename );
            else
                return ParserResult::ok( ParseResultType::Matched );
        }